

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O3

void __thiscall dynamicgraph::Entity::addCommand(Entity *this,string *inName,Command *command)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  const_iterator cVar3;
  ExceptionFactory *this_00;
  long *plVar4;
  size_type *psVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>
  item;
  ErrorCodeEnum local_74;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  cVar3 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dynamicgraph::command::Command_*>_>_>
          ::find(&(this->commandMap)._M_t,inName);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->commandMap)._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_70.first.field_2;
    pcVar2 = (inName->_M_dataplus)._M_p;
    local_70.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + inName->_M_string_length);
    local_70.second = command;
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>,std::_Select1st<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>&>
              ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>,std::_Select1st<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,dynamicgraph::command::Command*>>>
                *)&this->commandMap,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.first._M_dataplus._M_p,
                      local_70.first.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_00 = (ExceptionFactory *)__cxa_allocate_exception(0x30);
  local_74 = OBJECT_CONFLICT;
  std::operator+(&local_48,"Command ",inName);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_70.first._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_70.first._M_dataplus._M_p == psVar5) {
    local_70.first.field_2._M_allocated_capacity = *psVar5;
    local_70.first.field_2._8_8_ = plVar4[3];
    local_70.first._M_dataplus._M_p = (pointer)&local_70.first.field_2;
  }
  else {
    local_70.first.field_2._M_allocated_capacity = *psVar5;
  }
  local_70.first._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ExceptionFactory::ExceptionFactory(this_00,&local_74,&local_70.first);
  __cxa_throw(this_00,&ExceptionFactory::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

void Entity::addCommand(const std::string &inName, Command *command) {
  if (commandMap.count(inName) != 0) {
    DG_THROW ExceptionFactory(
        ExceptionFactory::OBJECT_CONFLICT,
        "Command " + inName + " already registered in Entity.");
  }
  std::pair<const std::string, Command *> item(inName, command);
  commandMap.insert(item);
}